

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

bool __thiscall V2Transport::ShouldReconnectV1(V2Transport *this)

{
  undefined1 uVar1;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock54;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock53;
  unique_lock<std::mutex> local_38;
  unique_lock<std::mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_initiating == true) {
    local_28._M_device = &(this->m_recv_mutex).super_mutex;
    local_28._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_28);
    if ((this->m_recv_state == KEY) &&
       ((this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      local_38._M_device = &(this->m_send_mutex).super_mutex;
      local_38._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_38);
      uVar1 = this->m_sent_v1_header_worth;
      std::unique_lock<std::mutex>::~unique_lock(&local_38);
    }
    else {
      uVar1 = 0;
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_28);
  }
  else {
    uVar1 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool V2Transport::ShouldReconnectV1() const noexcept
{
    AssertLockNotHeld(m_send_mutex);
    AssertLockNotHeld(m_recv_mutex);
    // Only outgoing connections need reconnection.
    if (!m_initiating) return false;

    LOCK(m_recv_mutex);
    // We only reconnect in the very first state and when the receive buffer is empty. Together
    // these conditions imply nothing has been received so far.
    if (m_recv_state != RecvState::KEY) return false;
    if (!m_recv_buffer.empty()) return false;
    // Check if we've sent enough for the other side to disconnect us (if it was V1).
    LOCK(m_send_mutex);
    return m_sent_v1_header_worth;
}